

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  XYZ Ref;
  ELLIPSOID type_00;
  ELLIPSOID type_01;
  int iVar1;
  FILE *__stream;
  long lVar2;
  SatPos *this;
  XYZ *this_00;
  char *pcVar3;
  char *__end;
  BLH *pBVar4;
  int desc;
  int port;
  string port_;
  string command;
  ELLIPSOID type;
  stringstream tmp;
  SPP SppSolver;
  ReadData_conflict decoder;
  SatPos Solver;
  int iStack_17430;
  int iStack_1742c;
  string sStack_17428;
  string sStack_17408;
  char *pcStack_173e8;
  long lStack_173e0;
  char acStack_173d8 [16];
  undefined4 uStack_173c8;
  undefined4 uStack_173c4;
  undefined4 uStack_173c0;
  undefined4 uStack_173bc;
  undefined4 uStack_173b8;
  undefined4 uStack_173b4;
  undefined4 uStack_173b0;
  undefined4 uStack_173ac;
  undefined4 uStack_173a8;
  undefined4 uStack_173a4;
  undefined4 uStack_173a0;
  undefined4 uStack_1739c;
  undefined4 uStack_17398;
  undefined4 uStack_17394;
  undefined4 uStack_17390;
  undefined4 uStack_1738c;
  undefined4 uStack_17388;
  undefined4 uStack_17384;
  undefined4 uStack_17380;
  undefined4 uStack_1737c;
  undefined4 uStack_17378;
  undefined4 uStack_17374;
  undefined4 uStack_17370;
  undefined4 uStack_1736c;
  XYZ XStack_17360;
  undefined1 *apuStack_17348 [2];
  undefined1 auStack_17338 [16];
  ELLIPSOID EStack_17328;
  undefined1 auStack_172f8 [16];
  undefined4 uStack_172e8;
  undefined4 uStack_172e4;
  undefined4 uStack_172e0;
  undefined4 uStack_172dc;
  undefined4 uStack_172d8;
  undefined4 uStack_172d4;
  undefined4 uStack_172d0;
  undefined4 uStack_172cc;
  ios_base aiStack_17278 [264];
  SPPResult SStack_17170;
  undefined1 auStack_15eb8 [184];
  undefined8 auStack_15e00 [884];
  BLH aBStack_14260 [1010];
  double local_e3a0;
  undefined1 local_e390 [40480];
  undefined8 local_4570;
  BLH local_4548;
  SatPos local_4530;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage: -i [IP address] [port]\n       -f [Binary File Path]",
               0x3a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string((string *)apuStack_17348,argv[1],(allocator *)auStack_15eb8);
  iVar1 = std::__cxx11::string::compare((char *)apuStack_17348);
  if (iVar1 == 0) {
    if (argc < 4 && argc != 2) {
      __stream = fopen(argv[2],"rb");
      ELLIPSOID::ELLIPSOID((ELLIPSOID *)auStack_172f8);
      if (__stream == (FILE *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"open file error",0xf);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        exit(-1);
      }
      lVar2 = 0x1c00;
      pBVar4 = (BLH *)(auStack_15eb8 + 0x58);
      do {
        pBVar4[-4].H = -1.0;
        BLH::BLH(pBVar4);
        pBVar4[-3].B = -1.0;
        pBVar4[-3].L = -1.0;
        pBVar4 = (BLH *)&pBVar4[4].H;
        lVar2 = lVar2 + -0x70;
      } while (lVar2 != 0);
      lVar2 = 0xe00;
      pBVar4 = aBStack_14260;
      do {
        pBVar4[-4].H = -1.0;
        BLH::BLH(pBVar4);
        pBVar4[-3].B = -1.0;
        pBVar4[-3].L = -1.0;
        pBVar4 = (BLH *)&pBVar4[4].H;
        lVar2 = lVar2 + -0x70;
      } while (lVar2 != 0);
      lVar2 = 0x2a18;
      do {
        *(undefined8 *)(auStack_15eb8 + lVar2) = 0xbff0000000000000;
        *(undefined8 *)((long)auStack_15e00 + lVar2) = 0xbff0000000000000;
        lVar2 = lVar2 + 0xd8;
      } while (lVar2 != 0x4518);
      lVar2 = 0x4518;
      do {
        *(undefined8 *)(auStack_15eb8 + lVar2) = 0xbff0000000000000;
        *(undefined8 *)((long)auStack_15e00 + lVar2) = 0xbff0000000000000;
        lVar2 = lVar2 + 0xd8;
      } while (lVar2 != 0x7b18);
      local_e3a0 = -1.0;
      memset(local_e390,0,0x7698);
      local_4570._0_4_ = 0;
      local_4570._4_4_ = 0;
      BLH::BLH(&local_4548);
      iVar1 = feof(__stream);
      if (iVar1 == 0) {
        do {
          iVar1 = ReadData::decode((ReadData *)auStack_15eb8,(FILE *)__stream);
          if (iVar1 == 0) {
            lVar2 = 0x1700;
            this = &local_4530;
            do {
              XYZ::XYZ((XYZ *)this);
              XYZ::XYZ(&this->Gps[0].SatVelocity);
              XYZ::XYZ(&this->Gps[0].GK);
              this->Gps[0].clkdif = 0.0;
              this->Gps[0].n = -1.0;
              this->Gps[0].clkdot = 0.0;
              this->Gps[0].Ekdot = 0.0;
              this = (SatPos *)(this->Gps + 1);
              lVar2 = lVar2 + -0xb8;
            } while (lVar2 != 0);
            lVar2 = 0x2e00;
            this_00 = &local_4530.Bds[0].SatPosition;
            do {
              XYZ::XYZ(this_00);
              XYZ::XYZ(this_00 + 1);
              XYZ::XYZ(this_00 + 2);
              this_00[5].Z = 0.0;
              this_00[6].X = -1.0;
              this_00[6].Y = 0.0;
              this_00[7].Y = 0.0;
              this_00 = (XYZ *)&this_00[7].Z;
              lVar2 = lVar2 + -0xb8;
            } while (lVar2 != 0);
            SPPResult::SPPResult(&SStack_17170);
            uStack_17378 = uStack_172d8;
            uStack_17374 = uStack_172d4;
            uStack_17370 = uStack_172d0;
            uStack_1736c = uStack_172cc;
            uStack_17388 = uStack_172e8;
            uStack_17384 = uStack_172e4;
            uStack_17380 = uStack_172e0;
            uStack_1737c = uStack_172dc;
            uStack_17398 = auStack_172f8._0_4_;
            uStack_17394 = auStack_172f8._4_4_;
            uStack_17390 = auStack_172f8._8_4_;
            uStack_1738c = auStack_172f8._12_4_;
            sStack_17428._M_dataplus._M_p = (pointer)&sStack_17428.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_17428,"./","");
            type_00.a._4_4_ = uStack_17394;
            type_00.a._0_4_ = uStack_17398;
            type_00.b._4_4_ = uStack_1738c;
            type_00.b._0_4_ = uStack_17390;
            type_00.c._4_4_ = uStack_17384;
            type_00.c._0_4_ = uStack_17388;
            type_00.alpha._4_4_ = uStack_1737c;
            type_00.alpha._0_4_ = uStack_17380;
            type_00.e2._4_4_ = uStack_17374;
            type_00.e2._0_4_ = uStack_17378;
            type_00.e1_2._4_4_ = uStack_1736c;
            type_00.e1_2._0_4_ = uStack_17370;
            solve(&local_4530,(SPP *)&SStack_17170,(ReadData *)auStack_15eb8,type_00,&sStack_17428);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_17428._M_dataplus._M_p != &sStack_17428.field_2) {
              operator_delete(sStack_17428._M_dataplus._M_p);
            }
          }
          iVar1 = feof(__stream);
        } while (iVar1 == 0);
      }
      iVar1 = 0;
      goto LAB_00107fe2;
    }
    lVar2 = 0x1c;
    pcVar3 = "Usage: -f [Binary File Path]";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)apuStack_17348);
    if (iVar1 == 0) {
      if (argc == 4) {
        std::__cxx11::string::string((string *)&pcStack_173e8,argv[3],(allocator *)auStack_15eb8);
        std::__cxx11::stringstream::stringstream((stringstream *)auStack_172f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_172e8,pcStack_173e8,lStack_173e0);
        std::istream::operator>>((istream *)auStack_172f8,&iStack_1742c);
        pcVar3 = argv[2];
        lVar2 = 0x1c00;
        pBVar4 = (BLH *)(auStack_15eb8 + 0x58);
        do {
          pBVar4[-4].H = -1.0;
          BLH::BLH(pBVar4);
          pBVar4[-3].B = -1.0;
          pBVar4[-3].L = -1.0;
          pBVar4 = (BLH *)&pBVar4[4].H;
          lVar2 = lVar2 + -0x70;
        } while (lVar2 != 0);
        lVar2 = 0xe00;
        pBVar4 = aBStack_14260;
        do {
          pBVar4[-4].H = -1.0;
          BLH::BLH(pBVar4);
          pBVar4[-3].B = -1.0;
          pBVar4[-3].L = -1.0;
          pBVar4 = (BLH *)&pBVar4[4].H;
          lVar2 = lVar2 + -0x70;
        } while (lVar2 != 0);
        lVar2 = 0x2a18;
        do {
          *(undefined8 *)(auStack_15eb8 + lVar2) = 0xbff0000000000000;
          *(undefined8 *)((long)auStack_15e00 + lVar2) = 0xbff0000000000000;
          lVar2 = lVar2 + 0xd8;
        } while (lVar2 != 0x4518);
        lVar2 = 0x4518;
        do {
          *(undefined8 *)(auStack_15eb8 + lVar2) = 0xbff0000000000000;
          *(undefined8 *)((long)auStack_15e00 + lVar2) = 0xbff0000000000000;
          lVar2 = lVar2 + 0xd8;
        } while (lVar2 != 0x7b18);
        local_e3a0 = -1.0;
        memset(local_e390,0,0x7698);
        local_4570._0_4_ = 0;
        local_4570._4_4_ = 0;
        BLH::BLH(&local_4548);
        iStack_17430 = 0;
        iVar1 = ReadData::OpenSocket((ReadData *)auStack_15eb8,pcVar3,iStack_1742c,&iStack_17430);
        if (iVar1 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"waiting for data ...",0x14);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          do {
            do {
              do {
                iVar1 = ReadData::decode((ReadData *)auStack_15eb8,iStack_17430);
              } while (iVar1 != 0);
              ELLIPSOID::ELLIPSOID(&EStack_17328);
              SatPos::SatPos(&local_4530);
              SPPResult::SPPResult(&SStack_17170);
              XYZ::XYZ(&XStack_17360,-2267800.069,5009341.6472,3220989.9179);
              Ref.Y = XStack_17360.Y;
              Ref.X = XStack_17360.X;
              Ref.Z = XStack_17360.Z;
              SPP::setRefPos((SPP *)&SStack_17170,Ref);
              uStack_173a8 = EStack_17328.e2._0_4_;
              uStack_173a4 = EStack_17328.e2._4_4_;
              uStack_173a0 = EStack_17328.e1_2._0_4_;
              uStack_1739c = EStack_17328.e1_2._4_4_;
              uStack_173b8 = EStack_17328.c._0_4_;
              uStack_173b4 = EStack_17328.c._4_4_;
              uStack_173b0 = EStack_17328.alpha._0_4_;
              uStack_173ac = EStack_17328.alpha._4_4_;
              uStack_173c8 = EStack_17328.a._0_4_;
              uStack_173c4 = EStack_17328.a._4_4_;
              uStack_173c0 = EStack_17328.b._0_4_;
              uStack_173bc = EStack_17328.b._4_4_;
              sStack_17408._M_dataplus._M_p = (pointer)&sStack_17408.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_17408,"./","");
              type_01.a._4_4_ = uStack_173c4;
              type_01.a._0_4_ = uStack_173c8;
              type_01.b._4_4_ = uStack_173bc;
              type_01.b._0_4_ = uStack_173c0;
              type_01.c._4_4_ = uStack_173b4;
              type_01.c._0_4_ = uStack_173b8;
              type_01.alpha._4_4_ = uStack_173ac;
              type_01.alpha._0_4_ = uStack_173b0;
              type_01.e2._4_4_ = uStack_173a4;
              type_01.e2._0_4_ = uStack_173a8;
              type_01.e1_2._4_4_ = uStack_1739c;
              type_01.e1_2._0_4_ = uStack_173a0;
              solve(&local_4530,(SPP *)&SStack_17170,(ReadData *)auStack_15eb8,type_01,&sStack_17408
                   );
            } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)sStack_17408._M_dataplus._M_p == &sStack_17408.field_2);
            operator_delete(sStack_17408._M_dataplus._M_p);
          } while( true );
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)auStack_172f8);
        std::ios_base::~ios_base(aiStack_17278);
        if (pcStack_173e8 != acStack_173d8) {
          operator_delete(pcStack_173e8);
        }
        goto LAB_00107fe2;
      }
      lVar2 = 0x1e;
      pcVar3 = "Usage: -i [IP address] [port]\n";
    }
    else {
      lVar2 = 0x3a;
      pcVar3 = "Usage: -i [IP address] [port]\n       -f [Binary File Path]";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  iVar1 = 1;
  std::ostream::flush();
LAB_00107fe2:
  if (apuStack_17348[0] != auStack_17338) {
    operator_delete(apuStack_17348[0]);
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv) {
    if(argc <= 1) {
        cout << "Usage: -i [IP address] [port]\n       -f [Binary File Path]" << endl;
        return 1;
    }
    string command = argv[1];

    if(command == "-f") {
        if(argc < 3 || argc >= 4) {
            cout << "Usage: -f [Binary File Path]" << endl;
            return 1;
        }
            
        char* filePath = argv[2];
        FILE* file = fopen(filePath, "rb");
        ELLIPSOID type;
        if(file == NULL) {
            cout << "open file error" << endl;
            exit(-1);
        }
        ReadData decoder;
        while(!feof(file)) {
            int flag = decoder.decode(file);
            if(flag != 0) 
                continue;
            SatPos Solver;
            SPP SppSolver;
            solve(Solver, SppSolver, decoder, type);
        }
        return 0;
    }

    else if(command == "-i") {
        if(argc < 4 || argc >= 5) {
            cout << "Usage: -i [IP address] [port]\n" << endl;
            return 1;
        }
        string port_ = argv[3];
        stringstream tmp;
        tmp << port_;
        int port;
        tmp >> port;
        char* ip = argv[2];

        ReadData decoder;
        int desc = 0;
        int flag = decoder.OpenSocket(ip, port, desc);
        if(flag != 0)
            return flag;
        cout << "waiting for data ..." << endl;
        while (true) {
            flag = decoder.decode(desc);
            if(flag != 0)
                continue;
            ELLIPSOID type;
            SatPos Solver;
            SPP SppSolver;
            SppSolver.setRefPos(XYZ(-2267800.0690, 5009341.6472, 3220989.9179));
            solve(Solver, SppSolver, decoder, type);
        }
    }
    else {
        cout << "Usage: -i [IP address] [port]\n       -f [Binary File Path]" << endl;
        return 1;
    }
    
}